

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)0>::decode<(unsigned_char)121,true>
          (Predecoder<(InstructionSet::M68k::Model)0> *this,uint16_t instruction)

{
  uint uVar1;
  Preinstruction PVar2;
  uint uVar3;
  byte local_2 [2];
  
  uVar3 = instruction & 7;
  uVar1 = instruction >> 3 & 7;
  local_2[0] = (byte)uVar1;
  local_2[1] = *(undefined1 *)((long)&(anonymous_namespace)::extended_modes + (ulong)uVar3);
  if ((0x10000 << (local_2[uVar1 + 1 >> 3] & 0x1f) & 0xe0820000U) != 0) {
    PVar2.operation = Undefined;
    PVar2.operands_[0] = '\r';
    PVar2.operands_[1] = '\r';
    PVar2.flags_ = '\0';
    return PVar2;
  }
  return (Preinstruction)
         (((local_2[uVar1 + 1 >> 3] & 0x1f) << 0xb | uVar3 << 8) + (instruction & 0xe00) * 0x80 +
         0x1000079);
}

Assistant:

Preinstruction Predecoder<model>::decode(uint16_t instruction) {
	// Fields used pervasively below.
	//
	// Underlying assumption: the compiler will discard whatever of these
	// isn't actually used.
	const auto ea_register = instruction & 7;
	const auto ea_mode = (instruction >> 3) & 7;
	const auto opmode = (instruction >> 6) & 7;
	const auto data_register = (instruction >> 9) & 7;

	//
	// Operations common to all processors.
	//
	switch(op) {
		default: break;

		//
		// MARK: ABCD, SBCD, ADDX.
		//
		// b9–b11:	Rx (destination)
		// b0–b2:	Ry (source)
		// b3:		1 => operation is memory-to-memory; 0 => register-to-register.
		//
		case OpT(Operation::ABCD):	case OpT(Operation::SBCD):
		case OpT(Operation::ADDXb):	case OpT(Operation::ADDXw):	case OpT(Operation::ADDXl):
		case OpT(Operation::SUBXb):	case OpT(Operation::SUBXw):	case OpT(Operation::SUBXl): {
			const auto addressing_mode = (instruction & 8) ?
				AddressingMode::AddressRegisterIndirectWithPredecrement : AddressingMode::DataRegisterDirect;

			return validated<op, validate>(
				addressing_mode, ea_register,
				addressing_mode, data_register);
		}

		//
		// MARK: AND, OR, EOR.
		//
		// b9–b11:			a register;
		// b0–b2 and b3–b5:	an effective address;
		// b6–b8:			an opmode, i.e. source + direction.
		//
		case ADDtoRb:	case ADDtoRw:	case ADDtoRl:
		case SUBtoRb:	case SUBtoRw:	case SUBtoRl:
		case ANDtoRb:	case ANDtoRw:	case ANDtoRl:
		case ORtoRb:	case ORtoRw:	case ORtoRl:
		case OpT(Operation::CMPb):	case OpT(Operation::CMPw):	case OpT(Operation::CMPl):
			return validated<op, validate>(
				combined_mode(ea_mode, ea_register), ea_register,
				AddressingMode::DataRegisterDirect, data_register);

		case ADDtoMb:	case ADDtoMw:	case ADDtoMl:
		case SUBtoMb:	case SUBtoMw:	case SUBtoMl:
		case ANDtoMb:	case ANDtoMw:	case ANDtoMl:
		case ORtoMb:	case ORtoMw:	case ORtoMl:
		case OpT(Operation::EORb):	case OpT(Operation::EORw):	case OpT(Operation::EORl):
			return validated<op, validate>(
				AddressingMode::DataRegisterDirect, data_register,
				combined_mode(ea_mode, ea_register), ea_register);

		case OpT(Operation::ADDAw):	case OpT(Operation::ADDAl):
		case OpT(Operation::SUBAw):	case OpT(Operation::SUBAl):
		case OpT(Operation::CMPAw):	case OpT(Operation::CMPAl):
			return validated<op, validate>(
				combined_mode(ea_mode, ea_register), ea_register,
				AddressingMode::AddressRegisterDirect, data_register);

		//
		// MARK: EORI, ORI, ANDI, SUBI, ADDI, CMPI, B[TST/CHG/CLR/SET]I
		//
		// Implicitly:		source is an immediate value;
		// b0–b2 and b3–b5:	destination effective address.
		//
		case EORIb:		case EORIl:		case EORIw:
		case ORIb:		case ORIl:		case ORIw:
		case ANDIb:		case ANDIl:		case ANDIw:
		case SUBIb:		case SUBIl:		case SUBIw:
		case ADDIb:		case ADDIl:		case ADDIw:
		case CMPIb:		case CMPIl:		case CMPIw:
		case BTSTI:		case BCHGI:
		case BCLRI:		case BSETI:
			return validated<op, validate>(
				AddressingMode::ImmediateData, 0,
				combined_mode(ea_mode, ea_register), ea_register);


		//
		// MARK: BTST, BCLR, BCHG, BSET
		//
		// b0–b2 and b3–b5:	destination effective address;
		// b9–b11:			source data register.
		//
		case OpT(Operation::BTST):	case OpT(Operation::BCLR):
		case OpT(Operation::BCHG):	case OpT(Operation::BSET):
			return validated<op, validate>(
				AddressingMode::DataRegisterDirect, data_register,
				combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: STOP, ANDItoCCR, ANDItoSR, EORItoCCR, EORItoSR, ORItoCCR, ORItoSR, BSRw
		//
		// Operand is an immedate; destination/source (if any) is implied by the operation,
		// e.g. ORItoSR has a destination of SR.
		//
		case OpT(Operation::STOP):
		case OpT(Operation::BSRw):
		case OpT(Operation::ORItoSR):	case OpT(Operation::ORItoCCR):
		case OpT(Operation::ANDItoSR):	case OpT(Operation::ANDItoCCR):
		case OpT(Operation::EORItoSR):	case OpT(Operation::EORItoCCR):
			return validated<op, validate>(AddressingMode::ImmediateData);

		//
		// MARK: Bccw
		//
		// Operand is an immedate; b8–b11 are a condition code.
		//
		case OpT(Operation::Bccw):
			return validated<op, validate>(
				AddressingMode::ImmediateData, 0,
				AddressingMode::None, 0,
				Condition((instruction >> 8) & 0xf));

		//
		// MARK: CHKw
		//
		// Implicitly:		destination is a register;
		// b0–b2 and b3–b5:	source effective address.
		//
		case OpT(Operation::CHKw):
			return validated<op, validate>(
				combined_mode(ea_mode, ea_register), ea_register,
				AddressingMode::DataRegisterDirect, data_register);

		//
		// MARK: EXG
		//
		// b0–b2:	register Ry (data or address, address if exchange is address <-> data);
		// b9–b11:	register Rx (data or address, data if exchange is address <-> data);
		// b3–b7:	an opmode, indicating address/data registers.
		//
		case EXGRtoR:
			return validated<op, validate>(
				AddressingMode::DataRegisterDirect, data_register,
				AddressingMode::DataRegisterDirect, ea_register);

		case EXGAtoA:
			return validated<op, validate>(
				AddressingMode::AddressRegisterDirect, data_register,
				AddressingMode::AddressRegisterDirect, ea_register);

		case EXGRtoA:
			return validated<op, validate>(
				AddressingMode::DataRegisterDirect, data_register,
				AddressingMode::AddressRegisterDirect, ea_register);

		//
		// MARK: MULU, MULS, DIVU, DIVS.
		//
		// b9–b11:			destination data register;
		// b0–b2 and b3–b5:	source effective address.
		//
		case OpT(Operation::DIVUw):	case OpT(Operation::DIVSw):
		case OpT(Operation::MULUw):	case OpT(Operation::MULSw):
			return validated<op, validate>(
				combined_mode(ea_mode, ea_register), ea_register,
				AddressingMode::DataRegisterDirect, data_register);

		//
		// MARK: LEA
		//
		// b9–b11:			destination address register;
		// b0–b2 and b3–b5:	source effective address.
		//
		case OpT(Operation::LEA):
			return validated<op, validate>(
				combined_mode(ea_mode, ea_register), ea_register,
				AddressingMode::AddressRegisterDirect, data_register);

		//
		// MARK: MOVEPtoRw, MOVEPtoRl
		//
		// b0–b2:	an address register;
		// b9–b11:	a data register.
		// [already decoded: b6–b8:	an opmode, indicating size and direction]
		//
		case OpT(MOVEPtoRw):	case OpT(MOVEPtoRl):
			return validated<op, validate>(
				AddressingMode::AddressRegisterIndirectWithDisplacement, ea_register,
				AddressingMode::DataRegisterDirect, data_register);

		case OpT(MOVEPtoMw):	case OpT(MOVEPtoMl):
			return validated<op, validate>(
				AddressingMode::DataRegisterDirect, data_register,
				AddressingMode::AddressRegisterIndirectWithDisplacement, ea_register);

		//
		// MARK: MOVE
		//
		// b0–b2 and b3–b5:		source effective address;
		// b6–b8 and b9–b11:	destination effective address;
		// [already decoded: b12–b13: size]
		//
		case OpT(Operation::MOVEb):		case OpT(Operation::MOVEl):		case OpT(Operation::MOVEw):
		case OpT(Operation::MOVEAl):	case OpT(Operation::MOVEAw):
			return validated<op, validate>(
				combined_mode(ea_mode, ea_register), ea_register,
				combined_mode(opmode, data_register), data_register);

		//
		// MARK: RESET, NOP RTE, RTS, TRAPV, RTR
		//
		// No additional fields.
		//
		case OpT(Operation::RESET):	case OpT(Operation::NOP):
		case OpT(Operation::RTE):	case OpT(Operation::RTS):	case OpT(Operation::TRAPV):
		case OpT(Operation::RTR):
			return validated<op, validate>();

		//
		// MARK: NEGX, CLR, NEG, MOVEtoCCR, MOVEtoSR, NOT, NBCD, PEA, TST
		//
		// b0–b2 and b3–b5:		effective address.
		//
		case OpT(Operation::CLRb):		case OpT(Operation::CLRw):		case OpT(Operation::CLRl):
		case OpT(Operation::JMP):		case OpT(Operation::JSR):
		case OpT(Operation::MOVEtoSR):	case OpT(Operation::MOVEfromSR):	case OpT(Operation::MOVEtoCCR):
		case OpT(Operation::NBCD):
		case OpT(Operation::NEGb):		case OpT(Operation::NEGw):		case OpT(Operation::NEGl):
		case OpT(Operation::NEGXb):		case OpT(Operation::NEGXw):		case OpT(Operation::NEGXl):
		case OpT(Operation::NOTb):		case OpT(Operation::NOTw):		case OpT(Operation::NOTl):
		case OpT(Operation::PEA):
		case OpT(Operation::TAS):
		case OpT(Operation::TSTb):		case OpT(Operation::TSTw):		case OpT(Operation::TSTl):
			return validated<op, validate>(combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: Scc
		//
		// b0–b2 and b3–b5:		effective address;
		// b8–b11:				a condition.
		//
		case OpT(Operation::Scc):
			return validated<op, validate>(
				combined_mode(ea_mode, ea_register), ea_register,
				AddressingMode::None, 0,
				Condition((instruction >> 8) & 0xf));

		//
		// MARK: UNLINK, MOVEtoUSP, MOVEfromUSP
		//
		// b0–b2:		an address register.
		//
		case OpT(Operation::UNLINK):
		case OpT(Operation::MOVEfromUSP):	case OpT(Operation::MOVEtoUSP):
			return validated<op, validate>(AddressingMode::AddressRegisterDirect, ea_register);

		//
		// MARK: DBcc
		//
		// b0–b2:		a data register;
		// b8–b11:		a condition.
		// Followed by an immediate value.
		//
		case OpT(Operation::DBcc):
			return validated<op, validate>(
				AddressingMode::DataRegisterDirect, ea_register,
				AddressingMode::ImmediateData, 0,
				Condition((instruction >> 8) & 0xf));

		//
		// MARK: SWAP, EXTbtow, EXTwtol
		//
		// b0–b2:		a data register.
		//
		case OpT(Operation::SWAP):
		case OpT(Operation::EXTbtow):	case OpT(Operation::EXTwtol):
			return validated<op, validate>(AddressingMode::DataRegisterDirect, ea_register);

		//
		// MARK: MOVEMtoMw, MOVEMtoMl, MOVEMtoRw, MOVEMtoRl
		//
		// b0–b2 and b3–b5:		effective address.
		// [already decoded: b10: direction]
		//
		case OpT(Operation::MOVEMtoMl):	case OpT(Operation::MOVEMtoMw):
		case OpT(Operation::MOVEMtoRl):	case OpT(Operation::MOVEMtoRw):
			return validated<op, validate>(
				AddressingMode::ExtensionWord, 0,
				combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: TRAP, BCCb, BSRb
		//
		// No further operands decoded, but one is somewhere in the opcode.
		//
		case OpT(Operation::TRAP):
		case OpT(Operation::BSRb):
			return validated<op, validate>(AddressingMode::Quick);

		case OpT(Operation::Bccb):
			return validated<op, validate>(
				AddressingMode::Quick, 0,
				AddressingMode::None, 0,
				Condition((instruction >> 8) & 0xf));

		//
		// MARK: LINKw
		//
		// b0–b2:		'source' address register;
		// Implicitly:	'destination' is an immediate.
		//
		case OpT(Operation::LINKw):
			return validated<op, validate>(
				AddressingMode::AddressRegisterDirect, ea_register,
				AddressingMode::ImmediateData, 0);

		//
		// MARK: ADDQ, SUBQ
		//
		// b0–b2 and b3–5:	a destination effective address;
		// b9–b11:			an immediate value, embedded in the opcode.
		//
		case ADDQb:		case ADDQw:		case ADDQl:
		case ADDQAw:	case ADDQAl:
		case SUBQb:		case SUBQw:		case SUBQl:
		case SUBQAw:	case SUBQAl:
			return validated<op, validate>(
				AddressingMode::Quick, 0,
				combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: MOVEq
		//
		// b9–b11:		a destination register;
		// b0–b7:		a 'quick' value.
		//
		case MOVEQ:
			return validated<op, validate>(
				AddressingMode::Quick, 0,
				AddressingMode::DataRegisterDirect, data_register);

		//
		// MARK: ASR, LSR, ROXR, ROR, ASL, LSL, ROXL, ROL
		//
		// b0–b2:	a register to shift (the source here, for consistency with the memory operations);
		// b8:		0 => b9–b11 are a direct count of bits to shift; 1 => b9–b11 identify a register containing the shift count;
		// b9–b11:	either a quick value or a register.
		//
		case OpT(Operation::ASRb):	case OpT(Operation::ASRw):	case OpT(Operation::ASRl):
		case OpT(Operation::LSRb):	case OpT(Operation::LSRw):	case OpT(Operation::LSRl):
		case OpT(Operation::ROXRb):	case OpT(Operation::ROXRw):	case OpT(Operation::ROXRl):
		case OpT(Operation::RORb):	case OpT(Operation::RORw):	case OpT(Operation::RORl):
		case OpT(Operation::ASLb):	case OpT(Operation::ASLw):	case OpT(Operation::ASLl):
		case OpT(Operation::LSLb):	case OpT(Operation::LSLw):	case OpT(Operation::LSLl):
		case OpT(Operation::ROXLb):	case OpT(Operation::ROXLw):	case OpT(Operation::ROXLl):
		case OpT(Operation::ROLb):	case OpT(Operation::ROLw):	case OpT(Operation::ROLl):
			return validated<op, validate>(
				(instruction & 0x20) ? AddressingMode::DataRegisterDirect : AddressingMode::Quick, data_register,
				AddressingMode::DataRegisterDirect, ea_register);

		//
		// MARK: ASRm, LSRm, ROXRm, RORm, ASLm, LSLm, ROXLm, ROLm
		//
		// b0–b2 and b3–5:	an effective address.
		//
		case OpT(Operation::ASRm):	case OpT(Operation::ASLm):
		case OpT(Operation::LSRm):	case OpT(Operation::LSLm):
		case OpT(Operation::ROXRm):	case OpT(Operation::ROXLm):
		case OpT(Operation::RORm):	case OpT(Operation::ROLm):
			return validated<op, validate>(combined_mode(ea_mode, ea_register), ea_register);

		case CMPMb:	case CMPMw:	case CMPMl:
			return validated<op, validate>(
					AddressingMode::AddressRegisterIndirectWithPostincrement, ea_register,
					AddressingMode::AddressRegisterIndirectWithPostincrement, data_register);
	}

	//
	// 68010 additions.
	//
	if constexpr (model < Model::M68010) {
		assert(false);
	}
	switch(op) {
		default: break;

		//
		// MARK: BKPT
		//
		// No further operands decoded, but one is somewhere in the opcode.
		//
		case OpT(Operation::BKPT):
			return validated<op, validate>(AddressingMode::Quick);

		//
		// MARK: RTD
		//
		case OpT(Operation::RTD):
			return validated<op, validate>(AddressingMode::ImmediateData);

		//
		// MARK: MOVE from CCR.
		//
		case OpT(Operation::MOVEfromCCR):
			return validated<op, validate>(combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: MOVE to/from C.
		//
		// No further information in the instruction, but an extension word is required.
		//
		case OpT(Operation::MOVEfromC):	case OpT(Operation::MOVEtoC):
			return validated<op, validate>(AddressingMode::ExtensionWord);

		//
		// MARK: MOVES
		//
		// b0–b2 and b3–b5:		effective address;
		// also an extension word is present to dictate a further register and a direction of transfer.
		//
		case OpT(Operation::MOVESb):	case OpT(Operation::MOVESw):	case OpT(Operation::MOVESl):
			return validated<op, validate>(
				AddressingMode::ExtensionWord, 0,
				combined_mode(ea_mode, ea_register), ea_register);
	}

	//
	// 68020 additions.
	//
	if constexpr (model < Model::M68020) {
		assert(false);
	}
	switch(op) {
		default: break;

		//
		// MARK: BSRl
		//
		// Operand is an immedate.
		//
		case OpT(Operation::BSRl):
			return validated<op, validate>(AddressingMode::ImmediateData);

		//
		// MARK: Bccl
		//
		// Operand is an immedate; b8–b11 are a condition code.
		//
		case OpT(Operation::Bccl):
			return validated<op, validate>(
				AddressingMode::ImmediateData, 0,
				AddressingMode::None, 0,
				Condition((instruction >> 8) & 0xf));

		//
		// MARK: DIVSl.
		//
		// b0–b2 and b3–b5:	source effective address.
		// Plus an immediate word operand
		//
		case OpT(Operation::DIVSorDIVUl):
		case OpT(Operation::MULSorMULUl):
			return validated<op, validate>(
				AddressingMode::ExtensionWord, 0,
				combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: BFCHG, BFTST, BFFFO, BFEXTU, BFEXTS, BFCLR, BFSET, BFINS
		//
		// b0–b2 and b3–b5: an effective address.
		// There is also an immedate operand describing an offset and width.
		//
		case OpT(Operation::BFCHG):		case OpT(Operation::BFTST):		case OpT(Operation::BFFFO):
		case OpT(Operation::BFEXTU):	case OpT(Operation::BFEXTS):	case OpT(Operation::BFCLR):
		case OpT(Operation::BFSET):		case OpT(Operation::BFINS):
			return validated<op, validate>(
				AddressingMode::ExtensionWord, 0,
				combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: CALLM
		//
		// b0–b2 and b3–b5: an effective address.
		// There is also an immedate operand providing argument count.
		//
		case OpT(Operation::CALLM):
			return validated<op, validate>(
				AddressingMode::ImmediateData, 0,
				combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: RTM
		//
		// b0–b2: a register number;
		// b3: address/data register selection.
		//
		case OpT(Operation::RTM): {
			const auto addressing_mode = (instruction & 8) ?
				AddressingMode::AddressRegisterDirect : AddressingMode::DataRegisterDirect;

			return validated<op, validate>(addressing_mode, ea_register);
		}

		//
		// MARK: TRAPcc
		//
		// Has 0, 1 or 2 following words, neither of which contributes to operation.
		//
		case OpT(Operation::TRAPcc): {
			switch(instruction & 7) {
				default:	return Preinstruction();

				// No extension.
				case 4: return validated<op, validate>();

				// Word-sized extension.
				case 2:	return validated<op, validate>(AddressingMode::ExtensionWord);

				// DWord-sized extension (which is encoded as two extension operands).
				case 3:
					return validated<op, validate>(
						AddressingMode::ExtensionWord, 0,
						AddressingMode::ExtensionWord, 0);
			}
		}

		//
		// MARK: PACK, UNPK
		//
		// b9–b11:	Rx (destination)
		// b0–b2:	Ry (source)
		// b3:		1 => operation is memory-to-memory; 0 => register-to-register.
		// This instruction is also followed by a 16-bit adjustment extension.
		//
		case OpT(Operation::PACK):
		case OpT(Operation::UNPK): {
			const auto addressing_mode = (instruction & 8) ?
				AddressingMode::AddressRegisterIndirectWithPredecrement : AddressingMode::DataRegisterDirect;

			return validated<op, validate>(
				addressing_mode, ea_register,
				addressing_mode, data_register,
				Condition::True, 1);
		}

		//
		// MARK: CAS
		//
		// b0–b2 and b3–b5: an effective address.
		// There is also an immedate operand describing relevant registers.
		//
		case OpT(Operation::CASb):	case OpT(Operation::CASw):	case OpT(Operation::CASl):
		case OpT(Operation::CHKorCMP2b):
		case OpT(Operation::CHKorCMP2w):
		case OpT(Operation::CHKorCMP2l):
			return validated<op, validate>(
				AddressingMode::ExtensionWord, 0,
				combined_mode(ea_mode, ea_register), ea_register);

		//
		// MARK: CAS2
		//
		// b0–b2 and b3–b5: an effective address.
		// There is also an immedate operand describing relevant registers.
		//
		case OpT(Operation::CAS2w):	case OpT(Operation::CAS2l):
			return validated<op, validate>(
				AddressingMode::ExtensionWord, 0,
				AddressingMode::ExtensionWord, 0);

		//
		// MARK: LINKl
		//
		// b0–b2:		'source' address register;
		// Implicitly:	'destination' is an immediate.
		//
		case OpT(Operation::LINKl):
			return validated<op, validate>(
				AddressingMode::AddressRegisterDirect, ea_register,
				AddressingMode::ImmediateData, 0);

		//
		// MARK: CHKl
		//
		// Implicitly:		destination is a register;
		// b0–b2 and b3–b5:	source effective address.
		//
		case OpT(Operation::CHKl):
			return validated<op, validate>(
				combined_mode(ea_mode, ea_register), ea_register,
				AddressingMode::DataRegisterDirect, data_register);

		//
		// MARK: EXTbtol
		//
		// b0–b2:		a data register.
		//
		case OpT(Operation::EXTbtol):
			return validated<op, validate>(AddressingMode::DataRegisterDirect, ea_register);

		//
		// MARK: DIVl
		//
		//
		// TODO.
	}

	// Should be unreachable.
	assert(false);
	return Preinstruction();	// To appease GCC during development.
}